

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

void __thiscall
LongReadsMapper::LongReadsMapper(LongReadsMapper *this,LongReadsDatastore *ds,LongReadsMapper *o)

{
  this->sg = o->sg;
  this->max_index_freq = 200;
  this->k = o->k;
  this->min_size = 1000;
  this->min_chain = 0x32;
  this->max_jump = 500;
  this->max_hits_to_candidate = 4;
  this->max_delta_change = 0x3c;
  this->min_number_of_node_occurrences = 0x32;
  this->datastore = ds;
  (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::vector(&this->first_mapping,&o->first_mapping);
  (this->all_paths_between)._M_h._M_buckets = &(this->all_paths_between)._M_h._M_single_bucket;
  (this->all_paths_between)._M_h._M_bucket_count = 1;
  (this->all_paths_between)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->all_paths_between)._M_h._M_element_count = 0;
  (this->all_paths_between)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->all_paths_between)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->all_paths_between)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&this->read_paths,&o->read_paths);
  *(undefined8 *)
   ((long)&(this->reads_in_node).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->reads_in_node).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->reads_in_node).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reads_in_node).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

LongReadsMapper::LongReadsMapper(const LongReadsDatastore &ds, const LongReadsMapper &o) :
datastore(ds),
sg(o.sg),
read_paths(o.read_paths),
first_mapping(o.first_mapping),
k(o.k)
{}